

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O1

void __thiscall amrex::DeriveRec::buildBC3D(DeriveRec *this,DescriptorList *d_list)

{
  int *__s;
  StateDescriptor *this_00;
  BCRec *pBVar1;
  int j;
  long lVar2;
  int iVar3;
  ulong __n;
  StateRange *pSVar4;
  
  if (this->bcr3D != (int *)0x0) {
    operator_delete__(this->bcr3D);
  }
  __n = 0xffffffffffffffff;
  if (-1 < (long)this->n_state) {
    __n = (long)this->n_state * 0x18;
  }
  __s = (int *)operator_new__(__n);
  memset(__s,0,__n);
  this->bcr3D = __s;
  for (pSVar4 = this->rng; pSVar4 != (StateRange *)0x0; pSVar4 = pSVar4->next) {
    this_00 = DescriptorList::operator[](d_list,pSVar4->typ);
    if (0 < pSVar4->nc) {
      iVar3 = 0;
      do {
        pBVar1 = StateDescriptor::getBC(this_00,pSVar4->sc + iVar3);
        lVar2 = 0;
        do {
          __s[lVar2] = pBVar1->bc[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        lVar2 = 3;
        do {
          __s[lVar2] = pBVar1->bc[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 6);
        __s = __s + 6;
        iVar3 = iVar3 + 1;
      } while (iVar3 < pSVar4->nc);
    }
  }
  return;
}

Assistant:

void
DeriveRec::buildBC3D (const DescriptorList& d_list)
{
    BL_ASSERT(nsr > 0);
    delete [] bcr3D;
    bcr3D = new int[2*3*n_state]();
    int* bci = bcr3D;
    for (DeriveRec::StateRange* r = rng; r != 0; r = r->next)
    {
        const StateDescriptor& d = d_list[r->typ];

        for (int k = 0; k < r->nc; k++)
        {
            const int* bc = d.getBC(r->sc + k).vect();

            for (int j = 0; j < AMREX_SPACEDIM; j++)
            {
                bci[j] = bc[j];
            }
            bci += 3;
            for (int j = 0; j < AMREX_SPACEDIM; j++)
            {
                bci[j] = bc[AMREX_SPACEDIM+j];
            }
            bci += 3;
        }
    }
}